

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O3

bool __thiscall
setup::anon_unknown_0::is_unsafe_path_char::operator()(is_unsafe_path_char *this,char c)

{
  uint uVar1;
  
  if (0x1f < (byte)this) {
    uVar1 = (uint)(char)(byte)this;
    if (((0x3f < uVar1) || ((0xd400040400000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
       (uVar1 != 0x7c)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool operator()(char c) {
		if(static_cast<unsigned char>(c) < 32) {
			return true;
		}
		switch(c) {
			case '<': return true;
			case '>': return true;
			case ':': return true;
			case '"': return true;
			case '|': return true;
			case '?': return true;
			case '*': return true;
			default:  return false;
		}
	}